

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O1

void __thiscall IntersectionHelper::intersect(IntersectionHelper *this)

{
  intersect_by_8(this);
  while ((this->run_it_ < this->run_end_ && (this->seq_it_ < this->seq_end_))) {
    step_single(this);
  }
  return;
}

Assistant:

void IntersectionHelper::intersect() {
    intersect_by_8();
    while (run_it_ < run_end_ && seq_it_ < seq_end_) {
        step_single();
    }
}